

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O0

slReturn ubxGetConfig(int fdPort,int verbosity,ubxConfig *config)

{
  ubxMsg pollMsg;
  ubxMsg pollMsg_00;
  ubxMsg pollMsg_01;
  ubxMsg pollMsg_02;
  ubxMsg pollMsg_03;
  ubxMsg pollMsg_04;
  ubxMsg pollMsg_05;
  errInfo error;
  errInfo error_00;
  errInfo error_01;
  errInfo error_02;
  errInfo error_03;
  errInfo error_04;
  errInfo error_05;
  _Bool _Var1;
  byte bVar2;
  int8_t iVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  int16_t iVar6;
  int32_t iVar7;
  uint32_t uVar8;
  slBuffer *psVar9;
  slReturn pvVar10;
  ubxGNSSConfig *puVar11;
  byte *pbVar12;
  uint64_t uVar13;
  void *pvVar14;
  errorInfo_slReturn local_2d0;
  slReturn local_2b0;
  slReturn nmeaResp;
  ubxMsg nmeaMsg;
  undefined8 local_288;
  undefined8 local_280;
  ubxType nmeaType;
  slReturn cn;
  char *local_260;
  char *local_258;
  uint32_t local_250;
  undefined4 uStack_24c;
  slReturn local_248;
  slReturn pmsResp;
  ubxMsg pmsMsg;
  undefined8 local_220;
  undefined8 local_218;
  undefined1 auStack_208 [6];
  ubxType pmsType;
  char *local_200;
  char *local_1f8;
  undefined8 local_1f0;
  slReturn rateResp;
  ubxMsg rateMsg;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined1 auStack_1a8 [2];
  ubxType rateType;
  uint32_t flags;
  char *local_1a0;
  char *local_198;
  undefined8 local_190;
  slReturn tp5Resp;
  ubxMsg tp5Msg;
  undefined8 local_160;
  undefined8 local_158;
  undefined1 auStack_148 [6];
  ubxType tp5Type;
  char *local_140;
  char *local_138;
  undefined8 local_130;
  slReturn nav5Resp;
  ubxMsg nav5Msg;
  undefined8 local_100;
  undefined8 local_f8;
  int local_ec;
  undefined1 auStack_e8 [2];
  ubxType nav5Type;
  int i;
  char *local_e0;
  char *local_d8;
  undefined8 local_d0;
  slReturn gnssResp;
  ubxMsg gnssMsg;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 auStack_88 [4];
  ubxType gnssType;
  uint16_t antMask;
  char *local_80;
  char *local_78;
  undefined8 local_70;
  slReturn antResp;
  ubxMsg antMsg;
  ubxMsg msg;
  slBuffer *body;
  ubxType antType;
  ubxConfig *config_local;
  int verbosity_local;
  int fdPort_local;
  
  psVar9 = create_slBuffer(0,LittleEndian);
  createUbxMsg((ubxMsg *)&antMsg.checksum,(ubxType)0x1306,psVar9);
  pollMsg.body = (slBuffer *)msg._0_8_;
  pollMsg.type.class = antMsg.checksum.ck_a;
  pollMsg.type.id = antMsg.checksum.ck_b;
  pollMsg._2_6_ = antMsg._18_6_;
  pollMsg._16_8_ = msg.body;
  pvVar10 = pollUbx(fdPort,pollMsg,1000,(ubxMsg *)&antResp);
  _Var1 = isErrorReturn(pvVar10);
  if (_Var1) {
    createErrorInfo((errorInfo_slReturn *)auStack_88,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c",
                    "ubxGetConfig",0x3e4,pvVar10);
    error.fileName = local_80;
    error.cause = _auStack_88;
    error.functionName = local_78;
    error._24_8_ = local_70;
    _verbosity_local = makeErrorMsgReturn(error,"problem getting antenna information from GPS");
  }
  else {
    uVar5 = get_uint16_slBuffer((slBuffer *)antMsg._0_8_,0);
    free(psVar9);
    free((void *)antMsg._0_8_);
    _Var1 = isBitSet_slBits((ulong)uVar5,0);
    config->antPwr = _Var1;
    _Var1 = isBitSet_slBits((ulong)uVar5,1);
    config->antShrtDet = _Var1;
    _Var1 = isBitSet_slBits((ulong)uVar5,2);
    config->antOpenDet = _Var1;
    _Var1 = isBitSet_slBits((ulong)uVar5,3);
    config->antPwrDwnOnShrt = _Var1;
    _Var1 = isBitSet_slBits((ulong)uVar5,4);
    config->antAutoRec = _Var1;
    psVar9 = create_slBuffer(0,LittleEndian);
    createUbxMsg((ubxMsg *)&gnssMsg.checksum,(ubxType)0x3e06,psVar9);
    antMsg.checksum = gnssMsg.checksum;
    antMsg._18_6_ = gnssMsg._18_6_;
    pollMsg_00.body = (slBuffer *)local_a0;
    pollMsg_00.type.class = gnssMsg.checksum.ck_a;
    pollMsg_00.type.id = gnssMsg.checksum.ck_b;
    pollMsg_00._2_6_ = gnssMsg._18_6_;
    pollMsg_00._16_8_ = local_98;
    pvVar10 = pollUbx(fdPort,pollMsg_00,1000,(ubxMsg *)&gnssResp);
    _Var1 = isErrorReturn(pvVar10);
    if (_Var1) {
      createErrorInfo((errorInfo_slReturn *)auStack_e8,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                      ,"ubxGetConfig",0x3f5,pvVar10);
      error_00.fileName = local_e0;
      error_00.cause = _auStack_e8;
      error_00.functionName = local_d8;
      error_00._24_8_ = local_d0;
      _verbosity_local = makeErrorMsgReturn(error_00,"problem getting GNSS information from GPS");
    }
    else {
      bVar2 = get_uint8_slBuffer((slBuffer *)gnssMsg._0_8_,1);
      config->trkChnnls = (uint)bVar2;
      bVar2 = get_uint8_slBuffer((slBuffer *)gnssMsg._0_8_,3);
      config->gnssRecs = (uint)bVar2;
      puVar11 = (ubxGNSSConfig *)safeMalloc((long)config->gnssRecs * 0x14);
      config->gnss = puVar11;
      for (local_ec = 0; local_ec < config->gnssRecs; local_ec = local_ec + 1) {
        bVar2 = get_uint8_slBuffer((slBuffer *)gnssMsg._0_8_,(long)local_ec * 8 + 4);
        config->gnss[local_ec].id = (uint)bVar2;
        bVar2 = get_uint8_slBuffer((slBuffer *)gnssMsg._0_8_,(long)local_ec * 8 + 5);
        config->gnss[local_ec].minChnnls = (uint)bVar2;
        bVar2 = get_uint8_slBuffer((slBuffer *)gnssMsg._0_8_,(long)local_ec * 8 + 6);
        config->gnss[local_ec].maxChnnls = (uint)bVar2;
        bVar2 = get_uint8_slBuffer((slBuffer *)gnssMsg._0_8_,(long)local_ec * 8 + 8);
        config->gnss[local_ec].enabled = (bVar2 & 1) != 0;
        bVar2 = get_uint8_slBuffer((slBuffer *)gnssMsg._0_8_,(long)local_ec * 8 + 10);
        config->gnss[local_ec].sigConfig = (uint)bVar2;
      }
      free(psVar9);
      free((void *)gnssMsg._0_8_);
      psVar9 = create_slBuffer(0,LittleEndian);
      createUbxMsg((ubxMsg *)&nav5Msg.checksum,(ubxType)0x2406,psVar9);
      antMsg.checksum = nav5Msg.checksum;
      antMsg._18_6_ = nav5Msg._18_6_;
      pollMsg_01.body = (slBuffer *)local_100;
      pollMsg_01.type.class = nav5Msg.checksum.ck_a;
      pollMsg_01.type.id = nav5Msg.checksum.ck_b;
      pollMsg_01._2_6_ = nav5Msg._18_6_;
      pollMsg_01._16_8_ = local_f8;
      pvVar10 = pollUbx(fdPort,pollMsg_01,2000,(ubxMsg *)&nav5Resp);
      _Var1 = isErrorReturn(pvVar10);
      if (_Var1) {
        createErrorInfo((errorInfo_slReturn *)auStack_148,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                        ,"ubxGetConfig",0x40a,pvVar10);
        error_01.fileName = local_140;
        error_01.cause = _auStack_148;
        error_01.functionName = local_138;
        error_01._24_8_ = local_130;
        _verbosity_local =
             makeErrorMsgReturn(error_01,"problem getting navigation engine information from GPS");
      }
      else {
        bVar2 = get_uint8_slBuffer((slBuffer *)nav5Msg._0_8_,2);
        config->model = (uint)bVar2;
        bVar2 = get_uint8_slBuffer((slBuffer *)nav5Msg._0_8_,3);
        config->mode = (uint)bVar2;
        iVar7 = get_int32_slBuffer((slBuffer *)nav5Msg._0_8_,4);
        config->fixedAltM = (double)iVar7 * 0.01;
        iVar7 = get_int32_slBuffer((slBuffer *)nav5Msg._0_8_,8);
        config->fixedAltVarM2 = (double)iVar7 * 0.0001;
        iVar3 = get_int8_slBuffer((slBuffer *)nav5Msg._0_8_,0xc);
        config->minElevDeg = (int)iVar3;
        uVar5 = get_uint16_slBuffer((slBuffer *)nav5Msg._0_8_,0xe);
        config->pDoP = (double)uVar5 * 0.1;
        uVar5 = get_uint16_slBuffer((slBuffer *)nav5Msg._0_8_,0x10);
        config->tDoP = (double)uVar5 * 0.1;
        uVar5 = get_uint16_slBuffer((slBuffer *)nav5Msg._0_8_,0x12);
        config->pAccM = uVar5;
        uVar5 = get_uint16_slBuffer((slBuffer *)nav5Msg._0_8_,0x14);
        config->tAccM = uVar5;
        uVar4 = get_uint8_slBuffer((slBuffer *)nav5Msg._0_8_,0x16);
        config->staticHoldThreshCmS = uVar4;
        uVar4 = get_uint8_slBuffer((slBuffer *)nav5Msg._0_8_,0x17);
        config->dgnssTimeoutS = uVar4;
        uVar4 = get_uint8_slBuffer((slBuffer *)nav5Msg._0_8_,0x18);
        config->cnoThreshNumSVs = uVar4;
        uVar4 = get_uint8_slBuffer((slBuffer *)nav5Msg._0_8_,0x19);
        config->cnoThreshDbHz = uVar4;
        uVar5 = get_uint16_slBuffer((slBuffer *)nav5Msg._0_8_,0x1c);
        config->staticHoldMaxDistM = uVar5;
        bVar2 = get_uint8_slBuffer((slBuffer *)nav5Msg._0_8_,0x1e);
        config->utcStandard = (uint)bVar2;
        free(psVar9);
        free((void *)nav5Msg._0_8_);
        psVar9 = create_slBuffer(1,LittleEndian);
        pbVar12 = buffer_slBuffer(psVar9);
        *pbVar12 = '\0';
        createUbxMsg((ubxMsg *)&tp5Msg.checksum,(ubxType)0x3106,psVar9);
        antMsg.checksum = tp5Msg.checksum;
        antMsg._18_6_ = tp5Msg._18_6_;
        pollMsg_02.body = (slBuffer *)local_160;
        pollMsg_02.type.class = tp5Msg.checksum.ck_a;
        pollMsg_02.type.id = tp5Msg.checksum.ck_b;
        pollMsg_02._2_6_ = tp5Msg._18_6_;
        pollMsg_02._16_8_ = local_158;
        pvVar10 = pollUbx(fdPort,pollMsg_02,1000,(ubxMsg *)&tp5Resp);
        _Var1 = isErrorReturn(pvVar10);
        if (_Var1) {
          createErrorInfo((errorInfo_slReturn *)auStack_1a8,
                          "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                          ,"ubxGetConfig",0x425,pvVar10);
          error_02.fileName = local_1a0;
          error_02.cause = _auStack_1a8;
          error_02.functionName = local_198;
          error_02._24_8_ = local_190;
          _verbosity_local =
               makeErrorMsgReturn(error_02,"problem getting time pulse information from GPS");
        }
        else {
          iVar6 = get_int16_slBuffer((slBuffer *)tp5Msg._0_8_,4);
          config->antCableDelayNs = iVar6;
          iVar6 = get_int16_slBuffer((slBuffer *)tp5Msg._0_8_,6);
          config->rfGroupDelayNs = iVar6;
          uVar8 = get_uint32_slBuffer((slBuffer *)tp5Msg._0_8_,8);
          config->freqPeriod = uVar8;
          uVar8 = get_uint32_slBuffer((slBuffer *)tp5Msg._0_8_,0xc);
          config->freqPeriodLock = uVar8;
          uVar8 = get_uint32_slBuffer((slBuffer *)tp5Msg._0_8_,0x10);
          config->pulseLenRatio = uVar8;
          uVar8 = get_uint32_slBuffer((slBuffer *)tp5Msg._0_8_,0x14);
          config->pulseLenRatioLock = uVar8;
          iVar7 = get_int32_slBuffer((slBuffer *)tp5Msg._0_8_,0x18);
          config->userConfigDelay = iVar7;
          uVar8 = get_uint32_slBuffer((slBuffer *)tp5Msg._0_8_,0x1c);
          _Var1 = isBitSet_slBits((ulong)uVar8,0);
          config->timePulse0Enabled = _Var1;
          _Var1 = isBitSet_slBits((ulong)uVar8,1);
          config->lockGpsFreq = _Var1;
          _Var1 = isBitSet_slBits((ulong)uVar8,2);
          config->lockedOtherSet = _Var1;
          _Var1 = isBitSet_slBits((ulong)uVar8,3);
          config->isFreq = _Var1;
          _Var1 = isBitSet_slBits((ulong)uVar8,4);
          config->isLength = _Var1;
          _Var1 = isBitSet_slBits((ulong)uVar8,5);
          config->alignToTow = _Var1;
          _Var1 = isBitSet_slBits((ulong)uVar8,6);
          config->polarity = _Var1;
          uVar13 = getBitField_slBits((ulong)uVar8,0x780);
          config->gridUtcTnss = (timegridType)uVar13;
          free(psVar9);
          free((void *)tp5Msg._0_8_);
          psVar9 = create_slBuffer(0,LittleEndian);
          createUbxMsg((ubxMsg *)&rateMsg.checksum,(ubxType)0x806,psVar9);
          antMsg.checksum = rateMsg.checksum;
          antMsg._18_6_ = rateMsg._18_6_;
          pollMsg_03.body = (slBuffer *)local_1c0;
          pollMsg_03.type.class = rateMsg.checksum.ck_a;
          pollMsg_03.type.id = rateMsg.checksum.ck_b;
          pollMsg_03._2_6_ = rateMsg._18_6_;
          pollMsg_03._16_8_ = local_1b8;
          pvVar10 = pollUbx(fdPort,pollMsg_03,1000,(ubxMsg *)&rateResp);
          _Var1 = isErrorReturn(pvVar10);
          if (_Var1) {
            createErrorInfo((errorInfo_slReturn *)auStack_208,
                            "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                            ,"ubxGetConfig",0x440,pvVar10);
            error_03.fileName = local_200;
            error_03.cause = _auStack_208;
            error_03.functionName = local_1f8;
            error_03._24_8_ = local_1f0;
            _verbosity_local =
                 makeErrorMsgReturn(error_03,"problem getting fix rate information from GPS");
          }
          else {
            uVar5 = get_uint16_slBuffer((slBuffer *)rateMsg._0_8_,0);
            config->measRateMs = uVar5;
            uVar5 = get_uint16_slBuffer((slBuffer *)rateMsg._0_8_,2);
            config->navRate = uVar5;
            uVar5 = get_uint16_slBuffer((slBuffer *)rateMsg._0_8_,4);
            config->timeRef = (uint)uVar5;
            free(psVar9);
            free((void *)rateMsg._0_8_);
            psVar9 = create_slBuffer(0,LittleEndian);
            createUbxMsg((ubxMsg *)&pmsMsg.checksum,(ubxType)0x8606,psVar9);
            antMsg.checksum = pmsMsg.checksum;
            antMsg._18_6_ = pmsMsg._18_6_;
            pollMsg_04.body = (slBuffer *)local_220;
            pollMsg_04.type.class = pmsMsg.checksum.ck_a;
            pollMsg_04.type.id = pmsMsg.checksum.ck_b;
            pollMsg_04._2_6_ = pmsMsg._18_6_;
            pollMsg_04._16_8_ = local_218;
            local_248 = pollUbx(fdPort,pollMsg_04,1000,(ubxMsg *)&pmsResp);
            _Var1 = isErrorReturn(local_248);
            if (_Var1) {
              createErrorInfo((errorInfo_slReturn *)&cn,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                              ,"ubxGetConfig",0x44e,local_248);
              error_04.fileName = local_260;
              error_04.cause = cn;
              error_04.functionName = local_258;
              error_04.lineNumber = local_250;
              error_04._28_4_ = uStack_24c;
              _verbosity_local =
                   makeErrorMsgReturn(error_04,"problem getting power mode information from GPS");
            }
            else {
              bVar2 = get_uint8_slBuffer((slBuffer *)pmsMsg._0_8_,1);
              config->powerSetup = (uint)bVar2;
              uVar5 = get_uint16_slBuffer((slBuffer *)pmsMsg._0_8_,2);
              config->powerIntervalSecs = uVar5;
              uVar5 = get_uint16_slBuffer((slBuffer *)pmsMsg._0_8_,4);
              config->powerOnTimeSecs = uVar5;
              free(psVar9);
              free((void *)pmsMsg._0_8_);
              _verbosity_local = isNmeaOn(fdPort);
              _Var1 = isErrorReturn(_verbosity_local);
              if (!_Var1) {
                pvVar14 = getReturnInfo(_verbosity_local);
                config->nmeaEnabled = pvVar14 != (void *)0x0;
                psVar9 = create_slBuffer(0,LittleEndian);
                createUbxMsg((ubxMsg *)&nmeaMsg.checksum,(ubxType)0x1706,psVar9);
                antMsg.checksum = nmeaMsg.checksum;
                antMsg._18_6_ = nmeaMsg._18_6_;
                pollMsg_05.body = (slBuffer *)local_288;
                pollMsg_05.type.class = nmeaMsg.checksum.ck_a;
                pollMsg_05.type.id = nmeaMsg.checksum.ck_b;
                pollMsg_05._2_6_ = nmeaMsg._18_6_;
                pollMsg_05._16_8_ = local_280;
                local_2b0 = pollUbx(fdPort,pollMsg_05,1000,(ubxMsg *)&nmeaResp);
                _Var1 = isErrorReturn(local_2b0);
                if (_Var1) {
                  createErrorInfo(&local_2d0,
                                  "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                                  ,"ubxGetConfig",0x462,local_2b0);
                  error_05.fileName = local_2d0.fileName;
                  error_05.cause = local_2d0.cause;
                  error_05.functionName = local_2d0.functionName;
                  error_05.lineNumber = local_2d0.lineNumber;
                  error_05._28_4_ = local_2d0._28_4_;
                  _verbosity_local =
                       makeErrorMsgReturn(error_05,
                                          "problem getting NMEA Version information from GPS");
                }
                else {
                  uVar4 = get_uint8_slBuffer((slBuffer *)nmeaMsg._0_8_,1);
                  config->nmeaVersion = uVar4;
                  free(psVar9);
                  free((void *)nmeaMsg._0_8_);
                  _verbosity_local = isNMEAmsgEnabled(fdPort,verbosity,GGA);
                  _Var1 = isErrorReturn(_verbosity_local);
                  if (!_Var1) {
                    pvVar14 = getReturnInfo(_verbosity_local);
                    config->GGA = pvVar14 != (void *)0x0;
                    _verbosity_local = isNMEAmsgEnabled(fdPort,verbosity,GLL);
                    _Var1 = isErrorReturn(_verbosity_local);
                    if (!_Var1) {
                      pvVar14 = getReturnInfo(_verbosity_local);
                      config->GLL = pvVar14 != (void *)0x0;
                      _verbosity_local = isNMEAmsgEnabled(fdPort,verbosity,GSA);
                      _Var1 = isErrorReturn(_verbosity_local);
                      if (!_Var1) {
                        pvVar14 = getReturnInfo(_verbosity_local);
                        config->GSA = pvVar14 != (void *)0x0;
                        _verbosity_local = isNMEAmsgEnabled(fdPort,verbosity,GSV);
                        _Var1 = isErrorReturn(_verbosity_local);
                        if (!_Var1) {
                          pvVar14 = getReturnInfo(_verbosity_local);
                          config->GSV = pvVar14 != (void *)0x0;
                          _verbosity_local = isNMEAmsgEnabled(fdPort,verbosity,RMC);
                          _Var1 = isErrorReturn(_verbosity_local);
                          if (!_Var1) {
                            pvVar14 = getReturnInfo(_verbosity_local);
                            config->RMC = pvVar14 != (void *)0x0;
                            _verbosity_local = isNMEAmsgEnabled(fdPort,verbosity,VTG);
                            _Var1 = isErrorReturn(_verbosity_local);
                            if (!_Var1) {
                              pvVar14 = getReturnInfo(_verbosity_local);
                              config->VTG = pvVar14 != (void *)0x0;
                              _verbosity_local = isNMEAmsgEnabled(fdPort,verbosity,GRS);
                              _Var1 = isErrorReturn(_verbosity_local);
                              if (!_Var1) {
                                pvVar14 = getReturnInfo(_verbosity_local);
                                config->GRS = pvVar14 != (void *)0x0;
                                _verbosity_local = isNMEAmsgEnabled(fdPort,verbosity,GST);
                                _Var1 = isErrorReturn(_verbosity_local);
                                if (!_Var1) {
                                  pvVar14 = getReturnInfo(_verbosity_local);
                                  config->GST = pvVar14 != (void *)0x0;
                                  _verbosity_local = isNMEAmsgEnabled(fdPort,verbosity,ZDA);
                                  _Var1 = isErrorReturn(_verbosity_local);
                                  if (!_Var1) {
                                    pvVar14 = getReturnInfo(_verbosity_local);
                                    config->ZDA = pvVar14 != (void *)0x0;
                                    _verbosity_local = makeOkReturn();
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return _verbosity_local;
}

Assistant:

extern slReturn ubxGetConfig(int fdPort, int verbosity, ubxConfig* config) {

    // get the antenna configuration...
    ubxType antType = { UBX_CFG, UBX_CFG_ANT };
    slBuffer* body = create_slBuffer(0, LittleEndian);
    ubxMsg msg = createUbxMsg(antType, body);
    ubxMsg antMsg;
    slReturn antResp = pollUbx(fdPort, msg, CFG_ANT_MAX_MS, &antMsg);
    if (isErrorReturn(antResp))
        return makeErrorMsgReturn(ERR_CAUSE(antResp), "problem getting antenna information from GPS");
    uint16_t antMask = get_uint16_slBuffer(antMsg.body, 0);
    free(body);
    free(antMsg.body);
    config->antPwr          = isBitSet_slBits(antMask, 0);
    config->antShrtDet      = isBitSet_slBits(antMask, 1);
    config->antOpenDet      = isBitSet_slBits(antMask, 2);
    config->antPwrDwnOnShrt = isBitSet_slBits(antMask, 3);
    config->antAutoRec      = isBitSet_slBits(antMask, 4);

    // get the GNSS configuration...
    ubxType gnssType = { UBX_CFG, UBX_CFG_GNSS };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(gnssType, body);
    ubxMsg gnssMsg;
    slReturn gnssResp = pollUbx(fdPort, msg, CFG_GNSS_MAX_MS, &gnssMsg);
    if (isErrorReturn(gnssResp))
        return makeErrorMsgReturn(ERR_CAUSE(gnssResp), "problem getting GNSS information from GPS");
    config->trkChnnls = get_uint8_slBuffer(gnssMsg.body, 1);
    config->gnssRecs = get_uint8_slBuffer(gnssMsg.body, 3);  // number of configuration blocks...
    config->gnss = safeMalloc(sizeof(ubxGNSSConfig) * config->gnssRecs);
    for (int i = 0; i < config->gnssRecs; i++) {
        config->gnss[i].id        = (gnssID) get_uint8_slBuffer(gnssMsg.body,  4 + 8 * (size_t)i);
        config->gnss[i].minChnnls =          get_uint8_slBuffer(gnssMsg.body,  5 + 8 * (size_t)i);
        config->gnss[i].maxChnnls =          get_uint8_slBuffer(gnssMsg.body,  6 + 8 * (size_t)i);
        config->gnss[i].enabled   = (bool)  (get_uint8_slBuffer(gnssMsg.body,  8 + 8 * (size_t)i) & 0x01);
        config->gnss[i].sigConfig =          get_uint8_slBuffer(gnssMsg.body, 10 + 8 * (size_t)i);
    }
    free(body);
    free(gnssMsg.body);

    // get the navigation engine configuration...
    ubxType nav5Type = { UBX_CFG, UBX_CFG_NAV5 };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(nav5Type, body);
    ubxMsg nav5Msg;
    slReturn nav5Resp = pollUbx(fdPort, msg, CFG_NAV5_MAX_MS, &nav5Msg);
    if (isErrorReturn(nav5Resp))
        return makeErrorMsgReturn(ERR_CAUSE(nav5Resp), "problem getting navigation engine information from GPS");
    config->model               = (dynModel) get_uint8_slBuffer(nav5Msg.body,  2);
    config->mode                = (fixMode)  get_uint8_slBuffer(nav5Msg.body,  3);
    config->fixedAltM           = 0.01 *     get_int32_slBuffer(nav5Msg.body,  4);
    config->fixedAltVarM2       = 0.0001 *   get_int32_slBuffer(nav5Msg.body,  8);
    config->minElevDeg          =            get_int8_slBuffer(nav5Msg.body, 12);
    config->pDoP                = 0.1 *      get_uint16_slBuffer(nav5Msg.body, 14);
    config->tDoP                = 0.1 *      get_uint16_slBuffer(nav5Msg.body, 16);
    config->pAccM               =            get_uint16_slBuffer(nav5Msg.body, 18);
    config->tAccM               =            get_uint16_slBuffer(nav5Msg.body, 20);
    config->staticHoldThreshCmS =            get_uint8_slBuffer(nav5Msg.body, 22);
    config->dgnssTimeoutS       =            get_uint8_slBuffer(nav5Msg.body, 23);
    config->cnoThreshNumSVs     =            get_uint8_slBuffer(nav5Msg.body, 24);
    config->cnoThreshDbHz       =            get_uint8_slBuffer(nav5Msg.body, 25);
    config->staticHoldMaxDistM  =            get_uint16_slBuffer(nav5Msg.body, 28);
    config->utcStandard         = (utcType)  get_uint8_slBuffer(nav5Msg.body, 30);
    free(body);
    free(nav5Msg.body);

    // get the time pulse configuration...
    ubxType tp5Type = { UBX_CFG, UBX_CFG_TP5 };
    body = create_slBuffer(1, LittleEndian);
    *buffer_slBuffer(body) = 0;  // we only look at time pulse zero...
    msg = createUbxMsg(tp5Type, body);
    ubxMsg tp5Msg;
    slReturn tp5Resp = pollUbx(fdPort, msg, CFG_TP5_MAX_MS, &tp5Msg);
    if (isErrorReturn(tp5Resp))
        return makeErrorMsgReturn(ERR_CAUSE(tp5Resp), "problem getting time pulse information from GPS");
    config->antCableDelayNs   = get_int16_slBuffer(tp5Msg.body,  4);
    config->rfGroupDelayNs    = get_int16_slBuffer(tp5Msg.body,  6);
    config->freqPeriod        = get_uint32_slBuffer(tp5Msg.body,  8);
    config->freqPeriodLock    = get_uint32_slBuffer(tp5Msg.body, 12);
    config->pulseLenRatio     = get_uint32_slBuffer(tp5Msg.body, 16);
    config->pulseLenRatioLock = get_uint32_slBuffer(tp5Msg.body, 20);
    config->userConfigDelay   = get_int32_slBuffer(tp5Msg.body, 24);
    uint32_t flags            = get_uint32_slBuffer(tp5Msg.body, 28);
    config->timePulse0Enabled = isBitSet_slBits(flags, 0);
    config->lockGpsFreq      = isBitSet_slBits(flags, 1);
    config->lockedOtherSet    = isBitSet_slBits(flags, 2);
    config->isFreq            = isBitSet_slBits(flags, 3);
    config->isLength          = isBitSet_slBits(flags, 4);
    config->alignToTow        = isBitSet_slBits(flags, 5);
    config->polarity          = isBitSet_slBits(flags, 6);
    config->gridUtcTnss       = (timegridType) getBitField_slBits(flags, 0x000000780);
    free(body);
    free(tp5Msg.body);

    // get the fix rate configuration...
    ubxType rateType = { UBX_CFG, UBX_CFG_RATE };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(rateType, body);
    ubxMsg rateMsg;
    slReturn rateResp = pollUbx(fdPort, msg, CFG_RATE_MAX_MS, &rateMsg);
    if (isErrorReturn(rateResp))
        return makeErrorMsgReturn(ERR_CAUSE(rateResp), "problem getting fix rate information from GPS");
    config->measRateMs =                  get_uint16_slBuffer(rateMsg.body, 0);
    config->navRate    =                  get_uint16_slBuffer(rateMsg.body, 2);
    config->timeRef    = (fixTimeRefType) get_uint16_slBuffer(rateMsg.body, 4);
    free(body);
    free(rateMsg.body);

    // get the power mode configuration...
    ubxType pmsType = { UBX_CFG, UBX_CFG_PMS };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(pmsType, body);
    ubxMsg pmsMsg;
    slReturn pmsResp = pollUbx(fdPort, msg, CFG_PMS_MAX_MS, &pmsMsg);
    if (isErrorReturn(pmsResp))
        return makeErrorMsgReturn(ERR_CAUSE(pmsResp), "problem getting power mode information from GPS");
    config->powerSetup        = (powerModeType) get_uint8_slBuffer(pmsMsg.body, 1);
    config->powerIntervalSecs =                 get_uint16_slBuffer(pmsMsg.body, 2);
    config->powerOnTimeSecs   =                 get_uint16_slBuffer(pmsMsg.body, 4);
    free(body);
    free(pmsMsg.body);

    // get the NMEA configuration...
    // is NMEA enabled?
    slReturn cn = isNmeaOn(fdPort);
    if (isErrorReturn(cn)) return cn;
    config->nmeaEnabled = getReturnInfoBool(cn);

    // get NMEA Version
    ubxType nmeaType = { UBX_CFG, UBX_CFG_NMEA };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(nmeaType, body);
    ubxMsg nmeaMsg;
    slReturn nmeaResp = pollUbx(fdPort, msg, CFG_NMEA_MAX_MS, &nmeaMsg);
    if (isErrorReturn(nmeaResp))
        return makeErrorMsgReturn(ERR_CAUSE(nmeaResp), "problem getting NMEA Version information from GPS");
    config->nmeaVersion        = get_uint8_slBuffer(nmeaMsg.body, 1);
    free(body);
    free(nmeaMsg.body);

    // Get NMEA sentence config
    cn = isNMEAmsgEnabled(fdPort, verbosity, GGA);
    if (isErrorReturn(cn)) return cn;
    config->GGA = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GLL);
    if (isErrorReturn(cn)) return cn;
    config->GLL = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GSA);
    if (isErrorReturn(cn)) return cn;
    config->GSA = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GSV);
    if (isErrorReturn(cn)) return cn;
    config->GSV = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, RMC);
    if (isErrorReturn(cn)) return cn;
    config->RMC = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, VTG);
    if (isErrorReturn(cn)) return cn;
    config->VTG = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GRS);
    if (isErrorReturn(cn)) return cn;
    config->GRS = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GST);
    if (isErrorReturn(cn)) return cn;
    config->GST = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, ZDA);
    if (isErrorReturn(cn)) return cn;
    config->ZDA = getReturnInfoBool(cn);

    return makeOkReturn();
}